

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibFindComplInputGate(Vec_Wrd_t *vFuncs,int iGate,int nFanins,int iFanin,int *piFaninNew)

{
  int iVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  int local_54;
  int i;
  word uTruthSwap;
  word uTruth;
  word uTruthFlip;
  word uTruthGate;
  int *piFaninNew_local;
  int iFanin_local;
  int nFanins_local;
  int iGate_local;
  Vec_Wrd_t *vFuncs_local;
  
  wVar2 = Vec_WrdEntry(vFuncs,iGate);
  wVar2 = Abc_Tt6Flip(wVar2,iFanin);
  if ((-1 < iFanin) && (iFanin < nFanins)) {
    if (piFaninNew != (int *)0x0) {
      *piFaninNew = iFanin;
    }
    for (local_54 = 0; iVar1 = Vec_WrdSize(vFuncs), local_54 < iVar1; local_54 = local_54 + 1) {
      wVar3 = Vec_WrdEntry(vFuncs,local_54);
      if (wVar3 == wVar2) {
        return local_54;
      }
    }
    if (-1 < iFanin + -1) {
      if (piFaninNew != (int *)0x0) {
        *piFaninNew = iFanin + -1;
      }
      wVar3 = Abc_Tt6SwapAdjacent(wVar2,iFanin + -1);
      for (local_54 = 0; iVar1 = Vec_WrdSize(vFuncs), local_54 < iVar1; local_54 = local_54 + 1) {
        wVar4 = Vec_WrdEntry(vFuncs,local_54);
        if (wVar4 == wVar3) {
          return local_54;
        }
      }
    }
    if (iFanin + 1 < nFanins) {
      if (piFaninNew != (int *)0x0) {
        *piFaninNew = iFanin + 1;
      }
      wVar2 = Abc_Tt6SwapAdjacent(wVar2,iFanin);
      for (local_54 = 0; iVar1 = Vec_WrdSize(vFuncs), local_54 < iVar1; local_54 = local_54 + 1) {
        wVar3 = Vec_WrdEntry(vFuncs,local_54);
        if (wVar3 == wVar2) {
          return local_54;
        }
      }
    }
    if (piFaninNew != (int *)0x0) {
      *piFaninNew = -1;
    }
    return -1;
  }
  __assert_fail("iFanin >= 0 && iFanin < nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                ,0xa6,"int Sfm_LibFindComplInputGate(Vec_Wrd_t *, int, int, int, int *)");
}

Assistant:

int Sfm_LibFindComplInputGate( Vec_Wrd_t * vFuncs, int iGate, int nFanins, int iFanin, int * piFaninNew )
{
    word uTruthGate = Vec_WrdEntry( vFuncs, iGate );
    word uTruthFlip = Abc_Tt6Flip( uTruthGate, iFanin ); 
    word uTruth, uTruthSwap;  int i;
    assert( iFanin >= 0 && iFanin < nFanins );
    if ( piFaninNew ) *piFaninNew = iFanin;
    Vec_WrdForEachEntry( vFuncs, uTruth, i )
        if ( uTruth == uTruthFlip )
            return i;
    if ( iFanin-1 >= 0 )
    {
        if ( piFaninNew ) *piFaninNew = iFanin-1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin-1 );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    if ( iFanin+1 < nFanins )
    {
        if ( piFaninNew ) *piFaninNew = iFanin+1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    // add checking for complemeting control input of a MUX
    if ( piFaninNew ) *piFaninNew = -1;
    return -1;
}